

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

bool Imf_3_2::anon_unknown_0::readDeepScanLine<Imf_3_2::DeepScanLineInputFile>
               (DeepScanLineInputFile *in,bool reduceMemory,bool reduceTime)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  bool bVar5;
  Array<void_*> *pAVar6;
  int *piVar7;
  long lVar8;
  Header *pHVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  void *pvVar12;
  long *plVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  size_type __new_size;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  size_t __n;
  int iVar21;
  long lVar22;
  int iVar23;
  bool bVar24;
  Array<Imf_3_2::Array<void_*>_> data;
  vector<float,_std::allocator<float>_> pixelBuffer;
  DeepFrameBuffer frameBuffer;
  
  Imf_3_2::DeepScanLineInputFile::header();
  piVar7 = (int *)Imf_3_2::Header::dataWindow();
  iVar2 = piVar7[2];
  lVar8 = (long)*piVar7;
  pHVar9 = (Header *)Imf_3_2::DeepScanLineInputFile::header();
  Imf_3_2::calculateBytesPerPixel(pHVar9);
  Imf_3_2::Header::channels();
  p_Var10 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  uVar1 = (iVar2 - lVar8) + 1;
  __n = 0;
  lVar22 = 0;
  while( true ) {
    Imf_3_2::Header::channels();
    p_Var11 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var10 == p_Var11) break;
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    lVar22 = lVar22 + 1;
    __n = __n + 0x10;
  }
  pvVar12 = operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
  plVar13 = (long *)operator_new__(__n + 8);
  *plVar13 = lVar22;
  data._data = (Array<void_*> *)(plVar13 + 1);
  iVar21 = (int)lVar22;
  data._size = lVar22;
  if (iVar21 != 0) {
    memset(data._data,0,__n);
    lVar16 = 8;
    lVar20 = lVar22;
    do {
      pAVar6 = data._data;
      pvVar14 = operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
      pvVar4 = *(void **)((long)&pAVar6->_size + lVar16);
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
      *(ulong *)((long)pAVar6 + lVar16 + -8) = uVar1;
      *(void **)((long)&pAVar6->_size + lVar16) = pvVar14;
      lVar16 = lVar16 + 0x10;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
  }
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_2::Slice::Slice
            ((Slice *)&pixelBuffer,UINT,(char *)((long)pvVar12 + lVar8 * -4),4,0,1,1,0.0,false,false
            );
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  Imf_3_2::Header::channels();
  p_Var10 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  lVar20 = 8;
  while( true ) {
    Imf_3_2::Header::channels();
    p_Var11 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var10 == p_Var11) break;
    Imf_3_2::DeepSlice::DeepSlice
              ((DeepSlice *)&pixelBuffer,FLOAT,
               (char *)(*(long *)((long)&(data._data)->_size + lVar20) + lVar8 * -8),8,0,4,1,1,0.0,
               false,false);
    Imf_3_2::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)(p_Var10 + 1));
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    lVar20 = lVar20 + 0x10;
  }
  Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)in);
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar23 = piVar7[1];
  bVar24 = piVar7[3] < iVar23;
  if (iVar23 <= piVar7[3]) {
    do {
      Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)in);
      if (uVar1 == 0) {
        __new_size = 0;
      }
      else {
        uVar15 = 0;
        __new_size = 0;
        do {
          if (iVar21 != 0) {
            __new_size = __new_size +
                         (ulong)*(uint *)((long)pvVar12 + uVar15 * 4) *
                         ((lVar22 - 1U & 0xffffffff) + 1);
          }
          uVar15 = uVar15 + 1;
        } while (uVar1 != uVar15);
      }
      std::vector<float,_std::allocator<float>_>::resize(&pixelBuffer,__new_size);
      if (uVar1 != 0) {
        lVar16 = 0;
        lVar20 = 0;
        do {
          if (iVar21 != 0) {
            uVar3 = *(uint *)((long)pvVar12 + lVar20 * 4);
            lVar17 = lVar16 * 4;
            lVar16 = lVar16 + lVar22 * (ulong)uVar3;
            lVar18 = 2;
            lVar19 = lVar22;
            do {
              if (uVar3 == 0) {
                *(undefined8 *)(*(long *)((long)&(data._data)->_size + lVar18 * 4) + lVar20 * 8) = 0
                ;
              }
              else {
                *(long *)(*(long *)((long)&(data._data)->_size + lVar18 * 4) + lVar20 * 8) =
                     (long)pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar17;
              }
              lVar18 = lVar18 + 4;
              lVar17 = lVar17 + (ulong)uVar3 * 4;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
          }
          bVar24 = lVar20 != iVar2 - lVar8;
          lVar20 = lVar20 + 1;
        } while (bVar24);
      }
      Imf_3_2::DeepScanLineInputFile::readPixels((int)in);
      bVar24 = piVar7[3] <= iVar23;
      bVar5 = iVar23 < piVar7[3];
      iVar23 = iVar23 + 1;
    } while (bVar5);
  }
  if (pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)pixelBuffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&frameBuffer);
  Array<Imf_3_2::Array<void_*>_>::~Array(&data);
  operator_delete__(pvVar12);
  return !bVar24;
}

Assistant:

bool
readDeepScanLine (T& in, bool reduceMemory, bool reduceTime)
{

    bool threw = false;
    try
    {
        const Header& fileHeader = in.header ();
        const Box2i&  dw         = fileHeader.dataWindow ();

        uint64_t w = static_cast<uint64_t> (dw.max.x) -
                     static_cast<uint64_t> (dw.min.x) + 1;
        int dwx = dw.min.x;

        uint64_t bytesPerSample = calculateBytesPerPixel (in.header ());

        //
        // in reduce memory mode, check size required by sampleCount table
        //
        if (reduceMemory && w * 4 > gMaxBytesPerScanline) { return false; }

        int channelCount = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, ++channelCount)
            ;

        Array<unsigned int> localSampleCount;
        localSampleCount.resizeErase (w);
        Array<Array<void*>> data (channelCount);

        for (int i = 0; i < channelCount; i++)
        {
            data[i].resizeErase (w);
        }

        DeepFrameBuffer frameBuffer;

        frameBuffer.insertSampleCountSlice (Slice (
            UINT, (char*) (&localSampleCount[-dwx]), sizeof (unsigned int), 0));

        int channel = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, ++channel)
        {
            PixelType type = FLOAT;

            int sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                i.name (),
                DeepSlice (
                    type,
                    (char*) (&data[channel][-dwx]),
                    pointerSize,
                    0,
                    sampleSize));
        }

        in.setFrameBuffer (frameBuffer);

        int step = 1;

        vector<float> pixelBuffer;

        for (int y = dw.min.y; y <= dw.max.y; y += step)
        {
            in.readPixelSampleCounts (y);

            //
            // count how many samples are required to store this scanline
            // in reduceMemory mode, pixels with large sample counts are not read,
            // but the library needs to allocate memory for them internally
            // - bufferSize is how much memory this function will allocate
            // - fileBufferSize tracks how much decompressed data the library will require
            //
            size_t bufferSize = 0;
            size_t fileBufferSize = 0;
            for (uint64_t j = 0; j < w; j++)
            {
                for (int k = 0; k < channelCount; k++)
                {
                    fileBufferSize += localSampleCount[j];
                    //
                    // don't read samples which require a lot of memory in reduceMemory mode
                    //

                    if (!reduceMemory || localSampleCount[j] * bytesPerSample <=
                                             gMaxBytesPerDeepPixel)
                    {
                        bufferSize += localSampleCount[j];
                    }
                }
            }

            //
            // limit total number of samples read in reduceMemory mode
            //
            if (!reduceMemory || fileBufferSize + bufferSize < gMaxBytesPerDeepScanline)
            {
                //
                // allocate sample buffer and set per-pixel pointers into buffer
                //
                pixelBuffer.resize (bufferSize);

                size_t bufferIndex = 0;
                for (uint64_t j = 0; j < w; j++)
                {
                    for (int k = 0; k < channelCount; k++)
                    {

                        if (localSampleCount[j] == 0 ||
                            (reduceMemory &&
                             localSampleCount[j] * bytesPerSample >
                                 gMaxBytesPerDeepPixel))
                        {
                            data[k][j] = nullptr;
                        }
                        else
                        {
                            data[k][j] = &pixelBuffer[bufferIndex];
                            bufferIndex += localSampleCount[j];
                        }
                    }
                }

                try
                {
                    in.readPixels (y);
                }
                catch (...)
                {
                    threw = true;
                    //
                    // in reduceTime mode, fail immediately - the file is corrupt
                    //
                    if (reduceTime) { return threw; }
                }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }
    return threw;
}